

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

bool __thiscall
pybind11::detail::values_and_holders::is_redundant_value_and_holder
          (values_and_holders *this,value_and_holder *vh)

{
  ulong uVar1;
  pointer pptVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    uVar1 = vh->index;
    if (uVar1 <= uVar5) break;
    pptVar2 = (this->tinfo->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar4 = PyType_IsSubtype(pptVar2[uVar5]->type,pptVar2[uVar1]->type);
    uVar3 = uVar5 + 1;
  } while (iVar4 == 0);
  return uVar5 < uVar1;
}

Assistant:

bool is_redundant_value_and_holder(const value_and_holder &vh) {
        for (size_t i = 0; i < vh.index; i++) {
            if (PyType_IsSubtype(tinfo[i]->type, tinfo[vh.index]->type) != 0) {
                return true;
            }
        }
        return false;
    }